

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avsd_base.c
# Opt level: O3

RK_S32 get_frame_fd(AvsdHalCtx_t *p_hal,RK_S32 idx)

{
  int iVar1;
  MppBuffer mbuffer;
  MppBuffer local_10;
  
  local_10 = (MppBuffer)0x0;
  mpp_buf_slot_get_prop(p_hal->frame_slots,idx,SLOT_BUFFER,&local_10);
  if (local_10 != (MppBuffer)0x0) {
    iVar1 = mpp_buffer_get_fd_with_caller(local_10,"get_frame_fd");
    return iVar1;
  }
  __assert_fail("mbuffer",
                "/workspace/llm4binary/github/license_c_cmakelists/HermanChen[P]mpp/mpp/hal/rkdec/avsd/hal_avsd_base.c"
                ,0x4c,"RK_S32 get_frame_fd(AvsdHalCtx_t *, RK_S32)");
}

Assistant:

RK_S32 get_frame_fd(AvsdHalCtx_t *p_hal, RK_S32 idx)
{
    RK_S32 ret_fd = 0;
    MppBuffer mbuffer = NULL;

    mpp_buf_slot_get_prop(p_hal->frame_slots, idx, SLOT_BUFFER, &mbuffer);
    assert(mbuffer);
    ret_fd = mpp_buffer_get_fd(mbuffer);

    return ret_fd;
}